

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

void initialise_mcurve(ec_curve *curve,mp_int *p,mp_int *a,mp_int *b,mp_int *G_x,uint log2_cofactor)

{
  mp_int *pmVar1;
  size_t sVar2;
  MontgomeryCurve *mc;
  MontgomeryPoint *pMVar3;
  
  curve->type = EC_MONTGOMERY;
  pmVar1 = mp_copy(p);
  curve->p = pmVar1;
  sVar2 = mp_get_nbits(p);
  curve->fieldBits = sVar2;
  curve->fieldBytes = sVar2 + 7 >> 3;
  mc = ecc_montgomery_curve(p,a,b);
  (curve->field_6).m.mc = mc;
  (curve->field_6).m.log2_cofactor = log2_cofactor;
  pMVar3 = ecc_montgomery_point_new(mc,G_x);
  (curve->field_6).m.G = pMVar3;
  return;
}

Assistant:

static void initialise_mcurve(
    struct ec_curve *curve, mp_int *p, mp_int *a, mp_int *b,
    mp_int *G_x, unsigned log2_cofactor)
{
    initialise_common(curve, EC_MONTGOMERY, p, 0);

    curve->m.mc = ecc_montgomery_curve(p, a, b);
    curve->m.log2_cofactor = log2_cofactor;

    curve->m.G = ecc_montgomery_point_new(curve->m.mc, G_x);
}